

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpio.c
# Opt level: O0

int gpioCfgInterfaces(uint ifFlags)

{
  FILE *pFVar1;
  char *pcVar2;
  uint in_EDI;
  int local_4;
  
  pFVar1 = _stderr;
  if ((3 < gpioCfg.dbgLevel) && ((gpioCfg.internals & 0x400) == 0)) {
    pcVar2 = myTimeStamp();
    fprintf(pFVar1,"%s %s: ifFlags=%X\n",pcVar2,"gpioCfgInterfaces",(ulong)in_EDI);
  }
  pFVar1 = _stderr;
  if (libInitialised == 0) {
    if (in_EDI < 0x10) {
      local_4 = 0;
      gpioCfg.ifFlags = in_EDI;
    }
    else {
      if ((gpioCfg.internals & 0x400) == 0) {
        pcVar2 = myTimeStamp();
        fprintf(pFVar1,"%s %s: bad ifFlags (%X)\n",pcVar2,"gpioCfgInterfaces",(ulong)in_EDI);
      }
      local_4 = -0x1a;
    }
  }
  else {
    if ((gpioCfg.internals & 0x400) == 0) {
      pcVar2 = myTimeStamp();
      fprintf(pFVar1,"%s %s: pigpio initialised, call gpioTerminate()\n",pcVar2,"gpioCfgInterfaces")
      ;
    }
    local_4 = -0x20;
  }
  return local_4;
}

Assistant:

int gpioCfgInterfaces(unsigned ifFlags)
{
   DBG(DBG_USER, "ifFlags=%X", ifFlags);

   CHECK_NOT_INITED;

   if (ifFlags > 15)
      SOFT_ERROR(PI_BAD_IF_FLAGS, "bad ifFlags (%X)", ifFlags);

   gpioCfg.ifFlags = ifFlags;

   return 0;
}